

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNWatc.cpp
# Opt level: O3

void __thiscall NaPNWatcher::action(NaPNWatcher *this)

{
  ExternalFunc p_Var1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  NaVector *pNVar5;
  NaPetriNet *this_00;
  NaTimer *pNVar6;
  
  pNVar5 = NaPetriCnInput::data(&this->events);
  iVar4 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[0x16])(this,pNVar5);
  if (((char)iVar4 != '\0') && (p_Var1 = this->m_pExtFunc, p_Var1 != (ExternalFunc)0x0)) {
    pvVar2 = this->m_pUserData;
    pNVar5 = NaPetriCnInput::data(&this->events);
    this_00 = NaPetriNode::net(&this->super_NaPetriNode);
    pNVar6 = NaPetriNet::timer(this_00);
    bVar3 = (*p_Var1)(pvVar2,pNVar5,pNVar6);
    if (!bVar3) {
      (*(this->super_NaPetriNode)._vptr_NaPetriNode[5])(this);
      return;
    }
  }
  return;
}

Assistant:

void
NaPNWatcher::action ()
{
  if(watcher(events.data()))
    if(NULL != m_pExtFunc)
      if(!(*m_pExtFunc)(m_pUserData, events.data(), net()->timer()))
	halt();
}